

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLElement::ShallowClone(XMLElement *this,XMLDocument *doc)

{
  XMLElement *pXVar1;
  char *name;
  XMLDocument *in_RSI;
  XMLElement *in_RDI;
  XMLAttribute *a;
  XMLElement *element;
  XMLNode *in_stack_ffffffffffffffb8;
  XMLElement *value;
  char *in_stack_ffffffffffffffc8;
  XMLAttribute *local_20;
  XMLDocument *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == (XMLDocument *)0x0) {
    local_10 = (in_RDI->super_XMLNode)._document;
  }
  XMLNode::Value(in_stack_ffffffffffffffb8);
  pXVar1 = XMLDocument::NewElement(local_10,in_stack_ffffffffffffffc8);
  for (local_20 = FirstAttribute(in_RDI); local_20 != (XMLAttribute *)0x0;
      local_20 = XMLAttribute::Next(local_20)) {
    value = pXVar1;
    name = XMLAttribute::Name((XMLAttribute *)0x2c519f);
    XMLAttribute::Value((XMLAttribute *)0x2c51ae);
    SetAttribute((XMLElement *)local_10,name,(char *)value);
  }
  return &pXVar1->super_XMLNode;
}

Assistant:

XMLNode* XMLElement::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLElement* element = doc->NewElement( Value() );					// fixme: this will always allocate memory. Intern?
    for( const XMLAttribute* a=FirstAttribute(); a; a=a->Next() ) {
        element->SetAttribute( a->Name(), a->Value() );					// fixme: this will always allocate memory. Intern?
    }
    return element;
}